

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

_Bool chck_buffer_resize(chck_buffer *buf,size_t size)

{
  uint8_t *puVar1;
  uint8_t *local_30;
  uint8_t *tmp;
  size_t size_local;
  chck_buffer *buf_local;
  
  if (buf != (chck_buffer *)0x0) {
    if (size == buf->size) {
      buf_local._7_1_ = true;
    }
    else if (size == 0) {
      chck_buffer_flush(buf);
      buf_local._7_1_ = true;
    }
    else {
      if ((buf->copied & 1U) == 0) {
        local_30 = (uint8_t *)0x0;
      }
      else {
        local_30 = buf->buffer;
      }
      puVar1 = (uint8_t *)realloc(local_30,size);
      if (puVar1 == (uint8_t *)0x0) {
        buf_local._7_1_ = false;
      }
      else {
        if ((long)size < (long)buf->curpos - (long)buf->buffer) {
          buf->curpos = puVar1 + (buf->size - size);
        }
        else {
          buf->curpos = puVar1 + ((long)buf->curpos - (long)buf->buffer);
        }
        buf->size = size;
        buf->buffer = puVar1;
        buf->copied = true;
        buf_local._7_1_ = true;
      }
    }
    return buf_local._7_1_;
  }
  __assert_fail("buf",
                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/buffer.c"
                ,0x94,"_Bool chck_buffer_resize(struct chck_buffer *, size_t)");
}

Assistant:

bool
chck_buffer_resize(struct chck_buffer *buf, size_t size)
{
   assert(buf);

   if (unlikely(size == buf->size))
      return true;

   if (unlikely(size == 0)) {
      chck_buffer_flush(buf);
      return true;
   }

   uint8_t *tmp;
   if (!(tmp = realloc((buf->copied ? buf->buffer : NULL), size)))
      return false;

   /* set new buffer position */
   if (buf->curpos - buf->buffer > (ptrdiff_t)size) {
      buf->curpos = tmp + (buf->size - size);
   } else {
      buf->curpos = tmp + (buf->curpos - buf->buffer);
   }

   buf->size = size;
   buf->buffer = tmp;
   buf->copied = true;
   return true;
}